

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void storeMapping(uint32_t codepoint,uint32_t *mapping,int32_t length,UStringPrepType type,
                 UErrorCode *status)

{
  FILE *__stream;
  UBool UVar1;
  short sVar2;
  uint32_t uVar3;
  void *pvVar4;
  undefined8 *value;
  char *pcVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  
  if (hashTable == (UHashtable *)0x0) {
    hashTable = uhash_open_63(hashEntry,compareEntries,(undefined1 *)0x0,status);
    uhash_setValueDeleter_63(hashTable,valueDeleter);
  }
  uVar3 = utrie_get32_63(sprepTrie,codepoint,(UBool *)0x0);
  if ((uVar3 == 0xfff2) || (uVar3 == 0)) {
    sVar11 = 0;
    for (sVar2 = 0; sVar2 < length; sVar2 = sVar2 + 1) {
      sVar11 = (sVar11 - (ushort)(mapping[sVar2] < 0x10000)) + 2;
    }
    if (sVar11 == 1) {
      if ((0x3fff < (int)(short)(codepoint - *mapping) + 0x2000U) ||
         (uVar3 = (codepoint - *mapping) * 0x10000 >> 0xe & 0xfffc, 0xffef < uVar3))
      goto LAB_00109e50;
    }
    else {
      if (sVar11 != 0) {
LAB_00109e50:
        iVar8 = (int)sVar11;
        pvVar4 = uprv_calloc_63((long)(iVar8 + 1),2);
        sVar6 = 0;
        for (sVar2 = 0; sVar2 < length; sVar2 = sVar2 + 1) {
          uVar7 = mapping[sVar2];
          if (uVar7 < 0x10000) {
            sVar10 = 1;
            sVar9 = sVar6;
          }
          else {
            sVar9 = sVar6 + 1;
            *(short *)((long)pvVar4 + (long)sVar6 * 2) = (short)(uVar7 >> 10) + -0x2840;
            uVar7 = uVar7 & 0x3ff | 0xdc00;
            sVar10 = 2;
          }
          sVar6 = sVar10 + sVar6;
          *(short *)((long)pvVar4 + (long)sVar9 * 2) = (short)uVar7;
        }
        value = (undefined8 *)uprv_malloc_63(0x10);
        *value = pvVar4;
        *(UStringPrepType *)((long)value + 0xc) = type;
        *(short *)(value + 1) = sVar11;
        if (3 < sVar11) {
          mappingDataCapacity = mappingDataCapacity + 1;
        }
        if (maxLength < iVar8) {
          maxLength = iVar8;
        }
        uhash_iput_63(hashTable,codepoint,value,status);
        __stream = _stderr;
        mappingDataCapacity = mappingDataCapacity + iVar8;
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          return;
        }
        pcVar5 = u_errorName_63(*status);
        fprintf(__stream,"Failed to put entries into the hastable. Error: %s\n",pcVar5);
        exit(*status);
      }
      uVar3 = 0xfefc;
    }
    UVar1 = utrie_set32_63(sprepTrie,codepoint,uVar3);
    if (UVar1 != '\0') {
      return;
    }
    fwrite("Could not set the value for code point.\n",0x28,1,_stderr);
  }
  else {
    fprintf(_stderr,"Type for codepoint \\U%08X already set!.\n",codepoint);
  }
  exit(1);
}

Assistant:

extern void
storeMapping(uint32_t codepoint, uint32_t* mapping,int32_t length,
             UStringPrepType type, UErrorCode* status){
    
 
    UChar* map = NULL;
    int16_t adjustedLen=0, i, j;
    uint16_t trieWord = 0;
    ValueStruct *value = NULL;
    uint32_t savedTrieWord = 0;

    /* initialize the hashtable */
    if(hashTable==NULL){
        hashTable = uhash_open(hashEntry, compareEntries, NULL, status);
        uhash_setValueDeleter(hashTable, valueDeleter);
    }
    
    /* figure out if the code point has type already stored */
    savedTrieWord= utrie_get32(sprepTrie,codepoint,NULL);
    if(savedTrieWord!=0){
        if((savedTrieWord- _SPREP_TYPE_THRESHOLD) == USPREP_PROHIBITED){
            /* turn on the first bit in trie word */
            trieWord += 0x01;
        }else{
            /* 
             * the codepoint has value something other than prohibited
             * and a mapping .. error! 
             */
            fprintf(stderr,"Type for codepoint \\U%08X already set!.\n", (int)codepoint);
            exit(U_ILLEGAL_ARGUMENT_ERROR); 
        } 
    }

    /* figure out the real length */ 
    for(i=0; i<length; i++){
        adjustedLen += U16_LENGTH(mapping[i]);
    }

    if(adjustedLen == 0){
        trieWord = (uint16_t)(_SPREP_MAX_INDEX_VALUE << 2);
        /* make sure that the value of trieWord is less than the threshold */
        if(trieWord < _SPREP_TYPE_THRESHOLD){   
            /* now set the value in the trie */
            if(!utrie_set32(sprepTrie,codepoint,trieWord)){
                fprintf(stderr,"Could not set the value for code point.\n");
                exit(U_ILLEGAL_ARGUMENT_ERROR);   
            }
            /* value is set so just return */
            return;
        }else{
            fprintf(stderr,"trieWord cannot contain value greater than threshold 0x%04X.\n",_SPREP_TYPE_THRESHOLD);
            exit(U_ILLEGAL_CHAR_FOUND);
        }
    }

    if(adjustedLen == 1){
        /* calculate the delta */
        int16_t delta = (int16_t)((int32_t)codepoint - (int16_t) mapping[0]);
        if(delta >= SPREP_DELTA_RANGE_NEGATIVE_LIMIT && delta <= SPREP_DELTA_RANGE_POSITIVE_LIMIT){

            trieWord = delta << 2;


            /* make sure that the second bit is OFF */
            if((trieWord & 0x02) != 0 ){
                fprintf(stderr,"The second bit in the trie word is not zero while storing a delta.\n");
                exit(U_INTERNAL_PROGRAM_ERROR);
            }
            /* make sure that the value of trieWord is less than the threshold */
            if(trieWord < _SPREP_TYPE_THRESHOLD){   
                /* now set the value in the trie */
                if(!utrie_set32(sprepTrie,codepoint,trieWord)){
                    fprintf(stderr,"Could not set the value for code point.\n");
                    exit(U_ILLEGAL_ARGUMENT_ERROR);   
                }
                /* value is set so just return */
                return;
            }
        }
        /* 
         * if the delta is not in the given range or if the trieWord is larger than the threshold
         * just fall through for storing the mapping in the mapping table
         */
    }

    map = (UChar*) uprv_calloc(adjustedLen + 1, U_SIZEOF_UCHAR);
    
    for (i=0, j=0; i<length; i++) {
        U16_APPEND_UNSAFE(map, j, mapping[i]);
    }
    
    value = (ValueStruct*) uprv_malloc(sizeof(ValueStruct));
    value->mapping = map;
    value->type    = type;
    value->length  = adjustedLen;
    if(value->length > _SPREP_MAX_INDEX_TOP_LENGTH){
        mappingDataCapacity++;
    }
    if(maxLength < value->length){
        maxLength = value->length;
    }
    uhash_iput(hashTable,codepoint,value,status);
    mappingDataCapacity += adjustedLen;

    if(U_FAILURE(*status)){
        fprintf(stderr, "Failed to put entries into the hastable. Error: %s\n", u_errorName(*status));
        exit(*status);
    }
}